

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::FullyConnectedLayer::calcOutput(FullyConnectedLayer *this)

{
  element_type *__va;
  float *__first;
  float *__last;
  float *__result;
  Array *outputs;
  FullyConnectedLayer *this_local;
  
  __va = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&(this->super_ABackpropLayer).shared.outputBuffer);
  __first = std::begin<float>(&this->inducedLocalField);
  __last = std::end<float>(&this->inducedLocalField);
  __result = std::begin<float>(__va);
  ::std::transform<float*,float*,notch::core::FullyConnectedLayer::calcOutput()::_lambda(float)_1_>
            (__first,__last,__result,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void calcOutput() {
        Array &outputs = *shared.outputBuffer;
        std::transform(std::begin(inducedLocalField),
                       std::end(inducedLocalField),
                       std::begin(outputs),
                       [&](float y) { return (*activationFunction)(y); });
    }